

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_digest.cpp
# Opt level: O0

void __thiscall argparse::args_t::parse_rc_option(args_t *this,char *str)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  
  iVar1 = strcmp(in_RSI,"complement");
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 0x18) = 0;
  }
  else {
    iVar1 = strcmp(in_RSI,"nocomplement");
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 0x18) = 1;
    }
    else {
      ERROR("invalid file operation: %s",in_RSI);
    }
  }
  return;
}

Assistant:

void args_t::parse_rc_option( const char * str )
    {
        if (!strcmp (str, "complement")) {
            rc = complement;
        } else if (!strcmp (str, "nocomplement")) {
            rc = nocomplement;
        } else  {
            ERROR( "invalid file operation: %s", str );
        }
    }